

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npn.hpp
# Opt level: O3

tuple<kitty::static_truth_table<4U,_true>,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
* __thiscall
kitty::
exact_npn_canonization<kitty::static_truth_table<4u,true>,void(kitty::static_truth_table<4u,true>const&)>
          (tuple<kitty::static_truth_table<4U,_true>,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           *__return_storage_ptr__,kitty *this,static_truth_table<4U,_true> *tt,
          _func_void_static_truth_table<4U,_true>_ptr *fn)

{
  void *__dest;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  byte bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  tuple<kitty::static_truth_table<4U,_true>,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *ptVar31;
  int shift;
  uchar uVar32;
  pointer puVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  size_t __n;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined8 extraout_XMM1_Qb_01;
  undefined8 extraout_XMM1_Qb_02;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int iVar59;
  int iVar62;
  int iVar63;
  undefined1 auVar60 [16];
  int iVar64;
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  int iVar78;
  int iVar82;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> perm;
  bool local_79;
  ulong local_78;
  ulong local_70;
  allocator_type local_61;
  ulong local_60;
  ulong local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  tuple<kitty::static_truth_table<4U,_true>,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_38;
  
  local_78 = *(ulong *)this;
  local_70 = (ulong)(~(uint)local_78 & 0xffff);
  uVar37 = local_78;
  if (local_70 < local_78) {
    uVar37 = local_70;
  }
  local_79 = local_70 <= local_78;
  local_38 = __return_storage_ptr__;
  (*(code *)tt)();
  (*(code *)tt)(&local_70);
  auVar40._8_8_ = extraout_XMM1_Qb;
  auVar40._0_8_ = extraout_XMM1_Qa;
  local_58 = 0xffffffff;
  if (detail::swaps._56_8_ == detail::swaps._48_8_) {
    local_60 = 0xffffffff;
  }
  else {
    local_60 = 0xffffffff;
    uVar35 = 0;
    do {
      uVar38 = (ulong)*(byte *)(detail::swaps._48_8_ + uVar35);
      bVar23 = (byte)(1L << (*(byte *)(detail::swaps._48_8_ + uVar35) & 0x3f));
      local_78 = (local_78 & *(ulong *)(detail::permutation_masks + uVar38 * 0x18 + 0x10)) >>
                 (bVar23 & 0x3f) |
                 (*(ulong *)(detail::permutation_masks + uVar38 * 0x18 + 8) & local_78) <<
                 (bVar23 & 0x3f) | *(ulong *)(detail::permutation_masks + uVar38 * 0x18) & local_78;
      local_70 = (local_70 & *(ulong *)(detail::permutation_masks + uVar38 * 0x18 + 0x10)) >>
                 (bVar23 & 0x3f) |
                 (*(ulong *)(detail::permutation_masks + uVar38 * 0x18 + 8) & local_70) <<
                 (bVar23 & 0x3f) | *(ulong *)(detail::permutation_masks + uVar38 * 0x18) & local_70;
      (*(code *)tt)(&local_78);
      (*(code *)tt)(&local_70);
      auVar40._8_8_ = extraout_XMM1_Qb_00;
      auVar40._0_8_ = extraout_XMM1_Qa_00;
      if (local_70 < uVar37 || local_78 < uVar37) {
        uVar37 = local_78;
        if (local_70 < local_78) {
          uVar37 = local_70;
        }
        local_79 = local_70 <= local_78;
        local_60 = uVar35 & 0xffffffff;
      }
      uVar35 = uVar35 + 1;
    } while (uVar35 < (ulong)(detail::swaps._56_8_ - detail::swaps._48_8_));
  }
  if (detail::flips._56_8_ != detail::flips._48_8_) {
    local_58 = 0xffffffff;
    uVar35 = 0;
    do {
      uVar36 = local_78 >> 1 & 0x2222222222222222 |
               local_78 * 2 & 0x4444444444444444 | local_78 & 0x9999999999999999;
      bVar23 = (byte)(1L << (*(byte *)(detail::flips._48_8_ + uVar35) & 0x3f));
      uVar38 = *(ulong *)(detail::projections + (ulong)*(byte *)(detail::flips._48_8_ + uVar35) * 8)
      ;
      local_78 = (uVar36 & uVar38) >> (bVar23 & 0x3f) | uVar36 << (bVar23 & 0x3f) & uVar38;
      uVar36 = local_70 >> 1 & 0x2222222222222222 |
               local_70 * 2 & 0x4444444444444444 | local_70 & 0x9999999999999999;
      local_70 = (uVar36 & uVar38) >> (bVar23 & 0x3f) | uVar36 << (bVar23 & 0x3f) & uVar38;
      (*(code *)tt)(&local_78);
      (*(code *)tt)(&local_70);
      auVar40._8_8_ = extraout_XMM1_Qb_01;
      auVar40._0_8_ = extraout_XMM1_Qa_01;
      if (local_70 < uVar37 || local_78 < uVar37) {
        uVar37 = local_78;
        if (local_70 < local_78) {
          uVar37 = local_70;
        }
        local_79 = local_70 <= local_78;
        local_60 = 0xffffffff;
        local_58 = uVar35 & 0xffffffff;
      }
      if (detail::swaps._56_8_ != detail::swaps._48_8_) {
        uVar38 = 0;
        do {
          uVar36 = (ulong)*(byte *)(detail::swaps._48_8_ + uVar38);
          bVar23 = (byte)(1L << (*(byte *)(detail::swaps._48_8_ + uVar38) & 0x3f));
          local_78 = (local_78 & *(ulong *)(detail::permutation_masks + uVar36 * 0x18 + 0x10)) >>
                     (bVar23 & 0x3f) |
                     (*(ulong *)(detail::permutation_masks + uVar36 * 0x18 + 8) & local_78) <<
                     (bVar23 & 0x3f) |
                     *(ulong *)(detail::permutation_masks + uVar36 * 0x18) & local_78;
          local_70 = (local_70 & *(ulong *)(detail::permutation_masks + uVar36 * 0x18 + 0x10)) >>
                     (bVar23 & 0x3f) |
                     (*(ulong *)(detail::permutation_masks + uVar36 * 0x18 + 8) & local_70) <<
                     (bVar23 & 0x3f) |
                     *(ulong *)(detail::permutation_masks + uVar36 * 0x18) & local_70;
          (*(code *)tt)(&local_78);
          (*(code *)tt)(&local_70);
          auVar40._8_8_ = extraout_XMM1_Qb_02;
          auVar40._0_8_ = extraout_XMM1_Qa_02;
          if (local_70 < uVar37 || local_78 < uVar37) {
            uVar37 = local_78;
            if (local_70 < local_78) {
              uVar37 = local_70;
            }
            local_79 = local_70 <= local_78;
            local_58 = uVar35 & 0xffffffff;
            local_60 = uVar38 & 0xffffffff;
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 < (ulong)(detail::swaps._56_8_ - detail::swaps._48_8_));
      }
      uVar35 = uVar35 + 1;
    } while (uVar35 < (ulong)(detail::flips._56_8_ - detail::flips._48_8_));
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_50,4,&local_61);
  ptVar31 = local_38;
  auVar30 = _DAT_00104090;
  auVar29 = _DAT_00104080;
  auVar28 = _DAT_00104070;
  auVar27 = _DAT_00104060;
  auVar26 = _DAT_00104050;
  auVar25 = _DAT_00104040;
  auVar24 = _DAT_00104030;
  if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar33 = local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish +
              (-1 - (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    auVar39._8_4_ = (int)puVar33;
    auVar39._0_8_ = puVar33;
    auVar39._12_4_ = (int)((ulong)puVar33 >> 0x20);
    uVar35 = 0;
    do {
      auVar57._8_4_ = (int)uVar35;
      auVar57._0_8_ = uVar35;
      auVar57._12_4_ = (int)(uVar35 >> 0x20);
      auVar60 = auVar39 ^ auVar30;
      auVar65 = (auVar57 | auVar29) ^ auVar30;
      iVar59 = auVar60._0_4_;
      iVar78 = -(uint)(iVar59 < auVar65._0_4_);
      iVar62 = auVar60._4_4_;
      auVar67._4_4_ = -(uint)(iVar62 < auVar65._4_4_);
      iVar63 = auVar60._8_4_;
      iVar82 = -(uint)(iVar63 < auVar65._8_4_);
      iVar64 = auVar60._12_4_;
      auVar67._12_4_ = -(uint)(iVar64 < auVar65._12_4_);
      auVar41._4_4_ = iVar78;
      auVar41._0_4_ = iVar78;
      auVar41._8_4_ = iVar82;
      auVar41._12_4_ = iVar82;
      auVar40 = pshuflw(auVar40,auVar41,0xe8);
      auVar66._4_4_ = -(uint)(auVar65._4_4_ == iVar62);
      auVar66._12_4_ = -(uint)(auVar65._12_4_ == iVar64);
      auVar66._0_4_ = auVar66._4_4_;
      auVar66._8_4_ = auVar66._12_4_;
      auVar65 = pshuflw(in_XMM2,auVar66,0xe8);
      auVar67._0_4_ = auVar67._4_4_;
      auVar67._8_4_ = auVar67._12_4_;
      auVar41 = pshuflw(auVar40,auVar67,0xe8);
      auVar60._8_4_ = 0xffffffff;
      auVar60._0_8_ = 0xffffffffffffffff;
      auVar60._12_4_ = 0xffffffff;
      auVar60 = (auVar41 | auVar65 & auVar40) ^ auVar60;
      auVar40 = packssdw(auVar60,auVar60);
      uVar32 = (uchar)uVar35;
      if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar35] = uVar32;
      }
      auVar10._4_4_ = iVar78;
      auVar10._0_4_ = iVar78;
      auVar10._8_4_ = iVar82;
      auVar10._12_4_ = iVar82;
      auVar67 = auVar66 & auVar10 | auVar67;
      auVar40 = packssdw(auVar67,auVar67);
      auVar65._8_4_ = 0xffffffff;
      auVar65._0_8_ = 0xffffffffffffffff;
      auVar65._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 ^ auVar65,auVar40 ^ auVar65);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40._0_4_ >> 8 & 1) != 0) {
        local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar35 + 1] = uVar32 + '\x01';
      }
      auVar40 = (auVar57 | auVar28) ^ auVar30;
      auVar50._0_4_ = -(uint)(iVar59 < auVar40._0_4_);
      auVar50._4_4_ = -(uint)(iVar62 < auVar40._4_4_);
      auVar50._8_4_ = -(uint)(iVar63 < auVar40._8_4_);
      auVar50._12_4_ = -(uint)(iVar64 < auVar40._12_4_);
      auVar68._4_4_ = auVar50._0_4_;
      auVar68._0_4_ = auVar50._0_4_;
      auVar68._8_4_ = auVar50._8_4_;
      auVar68._12_4_ = auVar50._8_4_;
      iVar78 = -(uint)(auVar40._4_4_ == iVar62);
      iVar82 = -(uint)(auVar40._12_4_ == iVar64);
      auVar11._4_4_ = iVar78;
      auVar11._0_4_ = iVar78;
      auVar11._8_4_ = iVar82;
      auVar11._12_4_ = iVar82;
      auVar79._4_4_ = auVar50._4_4_;
      auVar79._0_4_ = auVar50._4_4_;
      auVar79._8_4_ = auVar50._12_4_;
      auVar79._12_4_ = auVar50._12_4_;
      auVar40 = auVar11 & auVar68 | auVar79;
      auVar40 = packssdw(auVar40,auVar40);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 ^ auVar1,auVar40 ^ auVar1);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40._0_4_ >> 0x10 & 1) != 0) {
        local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar35 + 2] = uVar32 + '\x02';
      }
      auVar40 = pshufhw(auVar40,auVar68,0x84);
      auVar12._4_4_ = iVar78;
      auVar12._0_4_ = iVar78;
      auVar12._8_4_ = iVar82;
      auVar12._12_4_ = iVar82;
      auVar41 = pshufhw(auVar50,auVar12,0x84);
      auVar60 = pshufhw(auVar40,auVar79,0x84);
      auVar42._8_4_ = 0xffffffff;
      auVar42._0_8_ = 0xffffffffffffffff;
      auVar42._12_4_ = 0xffffffff;
      auVar42 = (auVar60 | auVar41 & auVar40) ^ auVar42;
      auVar40 = packssdw(auVar42,auVar42);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40._0_4_ >> 0x18 & 1) != 0) {
        local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar35 + 3] = uVar32 + '\x03';
      }
      auVar40 = (auVar57 | auVar27) ^ auVar30;
      auVar51._0_4_ = -(uint)(iVar59 < auVar40._0_4_);
      auVar51._4_4_ = -(uint)(iVar62 < auVar40._4_4_);
      auVar51._8_4_ = -(uint)(iVar63 < auVar40._8_4_);
      auVar51._12_4_ = -(uint)(iVar64 < auVar40._12_4_);
      auVar13._4_4_ = auVar51._0_4_;
      auVar13._0_4_ = auVar51._0_4_;
      auVar13._8_4_ = auVar51._8_4_;
      auVar13._12_4_ = auVar51._8_4_;
      auVar41 = pshuflw(auVar79,auVar13,0xe8);
      auVar43._0_4_ = -(uint)(auVar40._0_4_ == iVar59);
      auVar43._4_4_ = -(uint)(auVar40._4_4_ == iVar62);
      auVar43._8_4_ = -(uint)(auVar40._8_4_ == iVar63);
      auVar43._12_4_ = -(uint)(auVar40._12_4_ == iVar64);
      auVar69._4_4_ = auVar43._4_4_;
      auVar69._0_4_ = auVar43._4_4_;
      auVar69._8_4_ = auVar43._12_4_;
      auVar69._12_4_ = auVar43._12_4_;
      auVar40 = pshuflw(auVar43,auVar69,0xe8);
      auVar70._4_4_ = auVar51._4_4_;
      auVar70._0_4_ = auVar51._4_4_;
      auVar70._8_4_ = auVar51._12_4_;
      auVar70._12_4_ = auVar51._12_4_;
      auVar60 = pshuflw(auVar51,auVar70,0xe8);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 & auVar41,(auVar60 | auVar40 & auVar41) ^ auVar2);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar35 + 4] = uVar32 + '\x04';
      }
      auVar14._4_4_ = auVar51._0_4_;
      auVar14._0_4_ = auVar51._0_4_;
      auVar14._8_4_ = auVar51._8_4_;
      auVar14._12_4_ = auVar51._8_4_;
      auVar70 = auVar69 & auVar14 | auVar70;
      auVar60 = packssdw(auVar70,auVar70);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40,auVar60 ^ auVar3);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40._4_2_ >> 8 & 1) != 0) {
        local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar35 + 5] = uVar32 + '\x05';
      }
      auVar40 = (auVar57 | auVar26) ^ auVar30;
      auVar52._0_4_ = -(uint)(iVar59 < auVar40._0_4_);
      auVar52._4_4_ = -(uint)(iVar62 < auVar40._4_4_);
      auVar52._8_4_ = -(uint)(iVar63 < auVar40._8_4_);
      auVar52._12_4_ = -(uint)(iVar64 < auVar40._12_4_);
      auVar71._4_4_ = auVar52._0_4_;
      auVar71._0_4_ = auVar52._0_4_;
      auVar71._8_4_ = auVar52._8_4_;
      auVar71._12_4_ = auVar52._8_4_;
      iVar78 = -(uint)(auVar40._4_4_ == iVar62);
      iVar82 = -(uint)(auVar40._12_4_ == iVar64);
      auVar15._4_4_ = iVar78;
      auVar15._0_4_ = iVar78;
      auVar15._8_4_ = iVar82;
      auVar15._12_4_ = iVar82;
      auVar80._4_4_ = auVar52._4_4_;
      auVar80._0_4_ = auVar52._4_4_;
      auVar80._8_4_ = auVar52._12_4_;
      auVar80._12_4_ = auVar52._12_4_;
      auVar40 = auVar15 & auVar71 | auVar80;
      auVar40 = packssdw(auVar40,auVar40);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 ^ auVar4,auVar40 ^ auVar4);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar35 + 6] = uVar32 + '\x06';
      }
      auVar40 = pshufhw(auVar40,auVar71,0x84);
      auVar16._4_4_ = iVar78;
      auVar16._0_4_ = iVar78;
      auVar16._8_4_ = iVar82;
      auVar16._12_4_ = iVar82;
      auVar41 = pshufhw(auVar52,auVar16,0x84);
      auVar60 = pshufhw(auVar40,auVar80,0x84);
      auVar44._8_4_ = 0xffffffff;
      auVar44._0_8_ = 0xffffffffffffffff;
      auVar44._12_4_ = 0xffffffff;
      auVar44 = (auVar60 | auVar41 & auVar40) ^ auVar44;
      auVar40 = packssdw(auVar44,auVar44);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40._6_2_ >> 8 & 1) != 0) {
        local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar35 + 7] = uVar32 + '\a';
      }
      auVar40 = (auVar57 | auVar25) ^ auVar30;
      auVar53._0_4_ = -(uint)(iVar59 < auVar40._0_4_);
      auVar53._4_4_ = -(uint)(iVar62 < auVar40._4_4_);
      auVar53._8_4_ = -(uint)(iVar63 < auVar40._8_4_);
      auVar53._12_4_ = -(uint)(iVar64 < auVar40._12_4_);
      auVar17._4_4_ = auVar53._0_4_;
      auVar17._0_4_ = auVar53._0_4_;
      auVar17._8_4_ = auVar53._8_4_;
      auVar17._12_4_ = auVar53._8_4_;
      auVar41 = pshuflw(auVar80,auVar17,0xe8);
      auVar45._0_4_ = -(uint)(auVar40._0_4_ == iVar59);
      auVar45._4_4_ = -(uint)(auVar40._4_4_ == iVar62);
      auVar45._8_4_ = -(uint)(auVar40._8_4_ == iVar63);
      auVar45._12_4_ = -(uint)(auVar40._12_4_ == iVar64);
      auVar72._4_4_ = auVar45._4_4_;
      auVar72._0_4_ = auVar45._4_4_;
      auVar72._8_4_ = auVar45._12_4_;
      auVar72._12_4_ = auVar45._12_4_;
      auVar40 = pshuflw(auVar45,auVar72,0xe8);
      auVar73._4_4_ = auVar53._4_4_;
      auVar73._0_4_ = auVar53._4_4_;
      auVar73._8_4_ = auVar53._12_4_;
      auVar73._12_4_ = auVar53._12_4_;
      auVar60 = pshuflw(auVar53,auVar73,0xe8);
      auVar54._8_4_ = 0xffffffff;
      auVar54._0_8_ = 0xffffffffffffffff;
      auVar54._12_4_ = 0xffffffff;
      auVar54 = (auVar60 | auVar40 & auVar41) ^ auVar54;
      auVar60 = packssdw(auVar54,auVar54);
      auVar40 = packsswb(auVar40 & auVar41,auVar60);
      if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar35 + 8] = uVar32 + '\b';
      }
      auVar18._4_4_ = auVar53._0_4_;
      auVar18._0_4_ = auVar53._0_4_;
      auVar18._8_4_ = auVar53._8_4_;
      auVar18._12_4_ = auVar53._8_4_;
      auVar73 = auVar72 & auVar18 | auVar73;
      auVar60 = packssdw(auVar73,auVar73);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar5,auVar60 ^ auVar5);
      auVar40 = packsswb(auVar40,auVar60);
      if ((auVar40._8_2_ >> 8 & 1) != 0) {
        local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar35 + 9] = uVar32 + '\t';
      }
      auVar40 = (auVar57 | auVar24) ^ auVar30;
      auVar55._0_4_ = -(uint)(iVar59 < auVar40._0_4_);
      auVar55._4_4_ = -(uint)(iVar62 < auVar40._4_4_);
      auVar55._8_4_ = -(uint)(iVar63 < auVar40._8_4_);
      auVar55._12_4_ = -(uint)(iVar64 < auVar40._12_4_);
      auVar74._4_4_ = auVar55._0_4_;
      auVar74._0_4_ = auVar55._0_4_;
      auVar74._8_4_ = auVar55._8_4_;
      auVar74._12_4_ = auVar55._8_4_;
      iVar78 = -(uint)(auVar40._4_4_ == iVar62);
      iVar82 = -(uint)(auVar40._12_4_ == iVar64);
      auVar19._4_4_ = iVar78;
      auVar19._0_4_ = iVar78;
      auVar19._8_4_ = iVar82;
      auVar19._12_4_ = iVar82;
      auVar81._4_4_ = auVar55._4_4_;
      auVar81._0_4_ = auVar55._4_4_;
      auVar81._8_4_ = auVar55._12_4_;
      auVar81._12_4_ = auVar55._12_4_;
      auVar40 = auVar19 & auVar74 | auVar81;
      auVar40 = packssdw(auVar40,auVar40);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 ^ auVar6,auVar40 ^ auVar6);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar35 + 10] = uVar32 + '\n';
      }
      auVar40 = pshufhw(auVar40,auVar74,0x84);
      auVar20._4_4_ = iVar78;
      auVar20._0_4_ = iVar78;
      auVar20._8_4_ = iVar82;
      auVar20._12_4_ = iVar82;
      auVar41 = pshufhw(auVar55,auVar20,0x84);
      auVar60 = pshufhw(auVar40,auVar81,0x84);
      auVar46._8_4_ = 0xffffffff;
      auVar46._0_8_ = 0xffffffffffffffff;
      auVar46._12_4_ = 0xffffffff;
      auVar46 = (auVar60 | auVar41 & auVar40) ^ auVar46;
      auVar40 = packssdw(auVar46,auVar46);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40._10_2_ >> 8 & 1) != 0) {
        local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar35 + 0xb] = uVar32 + '\v';
      }
      auVar40 = (auVar57 | _DAT_00104020) ^ auVar30;
      auVar56._0_4_ = -(uint)(iVar59 < auVar40._0_4_);
      auVar56._4_4_ = -(uint)(iVar62 < auVar40._4_4_);
      auVar56._8_4_ = -(uint)(iVar63 < auVar40._8_4_);
      auVar56._12_4_ = -(uint)(iVar64 < auVar40._12_4_);
      auVar21._4_4_ = auVar56._0_4_;
      auVar21._0_4_ = auVar56._0_4_;
      auVar21._8_4_ = auVar56._8_4_;
      auVar21._12_4_ = auVar56._8_4_;
      auVar41 = pshuflw(auVar81,auVar21,0xe8);
      auVar47._0_4_ = -(uint)(auVar40._0_4_ == iVar59);
      auVar47._4_4_ = -(uint)(auVar40._4_4_ == iVar62);
      auVar47._8_4_ = -(uint)(auVar40._8_4_ == iVar63);
      auVar47._12_4_ = -(uint)(auVar40._12_4_ == iVar64);
      auVar75._4_4_ = auVar47._4_4_;
      auVar75._0_4_ = auVar47._4_4_;
      auVar75._8_4_ = auVar47._12_4_;
      auVar75._12_4_ = auVar47._12_4_;
      auVar40 = pshuflw(auVar47,auVar75,0xe8);
      auVar76._4_4_ = auVar56._4_4_;
      auVar76._0_4_ = auVar56._4_4_;
      auVar76._8_4_ = auVar56._12_4_;
      auVar76._12_4_ = auVar56._12_4_;
      auVar60 = pshuflw(auVar56,auVar76,0xe8);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 & auVar41,(auVar60 | auVar40 & auVar41) ^ auVar7);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar35 + 0xc] = uVar32 + '\f';
      }
      auVar22._4_4_ = auVar56._0_4_;
      auVar22._0_4_ = auVar56._0_4_;
      auVar22._8_4_ = auVar56._8_4_;
      auVar22._12_4_ = auVar56._8_4_;
      auVar76 = auVar75 & auVar22 | auVar76;
      auVar60 = packssdw(auVar76,auVar76);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40,auVar60 ^ auVar8);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40._12_2_ >> 8 & 1) != 0) {
        local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar35 + 0xd] = uVar32 + '\r';
      }
      auVar40 = (auVar57 | _DAT_00104010) ^ auVar30;
      auVar48._0_4_ = -(uint)(iVar59 < auVar40._0_4_);
      auVar48._4_4_ = -(uint)(iVar62 < auVar40._4_4_);
      auVar48._8_4_ = -(uint)(iVar63 < auVar40._8_4_);
      auVar48._12_4_ = -(uint)(iVar64 < auVar40._12_4_);
      auVar77._4_4_ = auVar48._0_4_;
      auVar77._0_4_ = auVar48._0_4_;
      auVar77._8_4_ = auVar48._8_4_;
      auVar77._12_4_ = auVar48._8_4_;
      auVar58._4_4_ = -(uint)(auVar40._4_4_ == iVar62);
      auVar58._12_4_ = -(uint)(auVar40._12_4_ == iVar64);
      auVar58._0_4_ = auVar58._4_4_;
      auVar58._8_4_ = auVar58._12_4_;
      auVar61._4_4_ = auVar48._4_4_;
      auVar61._0_4_ = auVar48._4_4_;
      auVar61._8_4_ = auVar48._12_4_;
      auVar61._12_4_ = auVar48._12_4_;
      auVar60 = auVar58 & auVar77 | auVar61;
      auVar40 = packssdw(auVar48,auVar60);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar40 = packssdw(auVar40 ^ auVar9,auVar40 ^ auVar9);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar35 + 0xe] = uVar32 + '\x0e';
      }
      auVar40 = pshufhw(auVar40,auVar77,0x84);
      in_XMM2 = pshufhw(auVar60,auVar58,0x84);
      in_XMM2 = in_XMM2 & auVar40;
      auVar40 = pshufhw(auVar40,auVar61,0x84);
      auVar49._8_4_ = 0xffffffff;
      auVar49._0_8_ = 0xffffffffffffffff;
      auVar49._12_4_ = 0xffffffff;
      auVar49 = (auVar40 | in_XMM2) ^ auVar49;
      auVar40 = packssdw(auVar49,auVar49);
      auVar40 = packsswb(auVar40,auVar40);
      if ((auVar40._14_2_ >> 8 & 1) != 0) {
        local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar35 + 0xf] = uVar32 + '\x0f';
      }
      uVar35 = uVar35 + 0x10;
    } while (((ulong)(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish +
                     (0xf - (long)local_50.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start)) & 0xfffffffffffffff0)
             != uVar35);
  }
  if (-1 < (int)local_60) {
    uVar35 = 0;
    do {
      uVar38 = (ulong)*(byte *)(detail::swaps._48_8_ + uVar35);
      uVar32 = local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar38];
      local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar38] =
           local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[uVar38 + 1];
      local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar38 + 1] = uVar32;
      uVar35 = uVar35 + 1;
    } while ((int)local_60 + 1 != uVar35);
  }
  uVar34 = (uint)(byte)(local_79 << 4);
  if (-1 < (int)local_58) {
    uVar35 = 0;
    do {
      uVar34 = uVar34 ^ 1 << (*(byte *)(detail::flips._48_8_ + uVar35) & 0x1f);
      uVar35 = uVar35 + 1;
    } while ((int)local_58 + 1 != uVar35);
  }
  *(undefined1 (*) [16])
   &(local_38->
    super__Tuple_impl<0UL,_kitty::static_truth_table<4U,_true>,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ).
    super__Tuple_impl<1UL,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    .super__Tuple_impl<2UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
    super__Head_base<2UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>.
    _M_head_impl.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl =
       (undefined1  [16])0x0;
  *(pointer *)
   ((long)&(local_38->
           super__Tuple_impl<0UL,_kitty::static_truth_table<4U,_true>,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ).
           super__Tuple_impl<1UL,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           .super__Tuple_impl<2UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
           super__Head_base<2UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>.
           _M_head_impl.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
   0x10) = (pointer)0x0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
             (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  __dest = *(void **)&(ptVar31->
                      super__Tuple_impl<0UL,_kitty::static_truth_table<4U,_true>,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ).
                      super__Tuple_impl<1UL,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      .
                      super__Tuple_impl<2UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      .
                      super__Head_base<2UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>
                      ._M_head_impl.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
  __n = (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
  if (__n != 0) {
    memmove(__dest,local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,__n);
  }
  *(pointer *)
   ((long)&(ptVar31->
           super__Tuple_impl<0UL,_kitty::static_truth_table<4U,_true>,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ).
           super__Tuple_impl<1UL,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           .super__Tuple_impl<2UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
           super__Head_base<2UL,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>.
           _M_head_impl.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
   8) = (pointer)((long)__dest + __n);
  (ptVar31->
  super__Tuple_impl<0UL,_kitty::static_truth_table<4U,_true>,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ).
  super__Tuple_impl<1UL,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
  super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = uVar34;
  (ptVar31->
  super__Tuple_impl<0UL,_kitty::static_truth_table<4U,_true>,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ).super__Head_base<0UL,_kitty::static_truth_table<4U,_true>,_false>._M_head_impl._bits = uVar37;
  if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return ptVar31;
}

Assistant:

std::tuple<TT, uint32_t, std::vector<uint8_t>> exact_npn_canonization( const TT& tt, Callback&& fn = detail::exact_npn_canonization_null_callback<TT> )
{
  static_assert( is_complete_truth_table<TT>::value, "Can only be applied on complete truth tables." );

  const auto num_vars = tt.num_vars();

  /* Special case for n = 0 */
  if ( num_vars == 0 )
  {
    const auto bit = get_bit( tt, 0 );
    return std::make_tuple( unary_not_if( tt, bit ), static_cast<uint32_t>( bit ), std::vector<uint8_t>{} );
  }

  /* Special case for n = 1 */
  if ( num_vars == 1 )
  {
    const auto bit1 = get_bit( tt, 1 );
    return std::make_tuple( unary_not_if( tt, bit1 ), static_cast<uint32_t>( bit1 << 1 ), std::vector<uint8_t>{ 0 } );
  }

  assert( num_vars >= 2 && num_vars <= 6 );

  auto t1 = tt, t2 = ~tt;
  auto tmin = std::min( t1, t2 );
  auto invo = tmin == t2;

  fn( t1 );
  fn( t2 );

  const auto& swaps = detail::swaps[num_vars - 2u];
  const auto& flips = detail::flips[num_vars - 2u];

  int best_swap = -1;
  int best_flip = -1;

  for ( std::size_t i = 0; i < swaps.size(); ++i )
  {
    const auto pos = swaps[i];
    swap_adjacent_inplace( t1, pos );
    swap_adjacent_inplace( t2, pos );

    fn( t1 );
    fn( t2 );

    if ( t1 < tmin || t2 < tmin )
    {
      best_swap = static_cast<int>( i );
      tmin = std::min( t1, t2 );
      invo = tmin == t2;
    }
  }

  for ( std::size_t j = 0; j < flips.size(); ++j )
  {
    const auto pos = flips[j];
    swap_adjacent_inplace( t1, 0 );
    flip_inplace( t1, pos );
    swap_adjacent_inplace( t2, 0 );
    flip_inplace( t2, pos );

    fn( t1 );
    fn( t2 );

    if ( t1 < tmin || t2 < tmin )
    {
      best_swap = -1;
      best_flip = static_cast<int>( j );
      tmin = std::min( t1, t2 );
      invo = tmin == t2;
    }

    for ( std::size_t i = 0; i < swaps.size(); ++i )
    {
      const auto pos = swaps[i];
      swap_adjacent_inplace( t1, pos );
      swap_adjacent_inplace( t2, pos );

      fn( t1 );
      fn( t2 );

      if ( t1 < tmin || t2 < tmin )
      {
        best_swap = static_cast<int>( i );
        best_flip = static_cast<int>( j );
        tmin = std::min( t1, t2 );
        invo = tmin == t2;
      }
    }
  }

  std::vector<uint8_t> perm( num_vars );
  std::iota( perm.begin(), perm.end(), 0u );

  for ( auto i = 0; i <= best_swap; ++i )
  {
    const auto pos = swaps[i];
    std::swap( perm[pos], perm[pos + 1] );
  }

  uint32_t phase = uint32_t( invo ) << num_vars;
  for ( auto i = 0; i <= best_flip; ++i )
  {
    phase ^= 1 << flips[i];
  }

  return std::make_tuple( tmin, phase, perm );
}